

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram.c
# Opt level: O0

int hdr_calculate_bucket_config
              (int64_t lowest_discernible_value,int64_t highest_trackable_value,
              int significant_figures,hdr_histogram_bucket_config *cfg)

{
  int32_t iVar1;
  int64_t iVar2;
  double dVar3;
  double dVar4;
  int local_54;
  double unit_magnitude;
  int64_t largest_value_with_single_unit_resolution;
  int32_t sub_bucket_count_magnitude;
  hdr_histogram_bucket_config *cfg_local;
  int significant_figures_local;
  int64_t highest_trackable_value_local;
  int64_t lowest_discernible_value_local;
  
  if ((((lowest_discernible_value < 1) || (significant_figures < 1)) || (5 < significant_figures))
     || (lowest_discernible_value * 2 - highest_trackable_value != 0 &&
         highest_trackable_value <= lowest_discernible_value * 2)) {
    lowest_discernible_value_local._4_4_ = 0x16;
  }
  else {
    cfg->lowest_discernible_value = lowest_discernible_value;
    cfg->significant_figures = (long)significant_figures;
    cfg->highest_trackable_value = highest_trackable_value;
    iVar2 = power(10,(long)significant_figures);
    dVar3 = log((double)(iVar2 << 1));
    dVar4 = log(2.0);
    dVar3 = ceil(dVar3 / dVar4);
    local_54 = (int)dVar3;
    if (local_54 < 2) {
      local_54 = 1;
    }
    cfg->sub_bucket_half_count_magnitude = local_54 + -1;
    dVar3 = log((double)lowest_discernible_value);
    dVar4 = log(2.0);
    if (dVar3 / dVar4 <= 2147483647.0) {
      cfg->unit_magnitude = (long)(int)(dVar3 / dVar4);
      dVar3 = pow(2.0,(double)(cfg->sub_bucket_half_count_magnitude + 1));
      cfg->sub_bucket_count = (int)dVar3;
      cfg->sub_bucket_half_count = cfg->sub_bucket_count / 2;
      cfg->sub_bucket_mask = (long)cfg->sub_bucket_count + -1 << ((byte)cfg->unit_magnitude & 0x3f);
      if (cfg->unit_magnitude + (long)cfg->sub_bucket_half_count_magnitude < 0x3e) {
        iVar1 = buckets_needed_to_cover_value
                          (highest_trackable_value,cfg->sub_bucket_count,
                           (int32_t)cfg->unit_magnitude);
        cfg->bucket_count = iVar1;
        cfg->counts_len = (cfg->bucket_count + 1) * (cfg->sub_bucket_count / 2);
        lowest_discernible_value_local._4_4_ = 0;
      }
      else {
        lowest_discernible_value_local._4_4_ = 0x16;
      }
    }
    else {
      lowest_discernible_value_local._4_4_ = 0x16;
    }
  }
  return lowest_discernible_value_local._4_4_;
}

Assistant:

int hdr_calculate_bucket_config(
    int64_t lowest_discernible_value,
    int64_t highest_trackable_value,
    int significant_figures,
    struct hdr_histogram_bucket_config* cfg)
{
    int32_t sub_bucket_count_magnitude;
    int64_t largest_value_with_single_unit_resolution;

    if (lowest_discernible_value < 1 ||
            significant_figures < 1 || 5 < significant_figures ||
            lowest_discernible_value * 2 > highest_trackable_value)
    {
        return EINVAL;
    }

    cfg->lowest_discernible_value = lowest_discernible_value;
    cfg->significant_figures = significant_figures;
    cfg->highest_trackable_value = highest_trackable_value;

    largest_value_with_single_unit_resolution = 2 * power(10, significant_figures);
    sub_bucket_count_magnitude = (int32_t) ceil(log((double)largest_value_with_single_unit_resolution) / log(2));
    cfg->sub_bucket_half_count_magnitude = ((sub_bucket_count_magnitude > 1) ? sub_bucket_count_magnitude : 1) - 1;

    double unit_magnitude = log((double)lowest_discernible_value) / log(2);
    if (INT32_MAX < unit_magnitude)
    {
        return EINVAL;
    }

    cfg->unit_magnitude = (int32_t) unit_magnitude;
    cfg->sub_bucket_count      = (int32_t) pow(2, (cfg->sub_bucket_half_count_magnitude + 1));
    cfg->sub_bucket_half_count = cfg->sub_bucket_count / 2;
    cfg->sub_bucket_mask       = ((int64_t) cfg->sub_bucket_count - 1) << cfg->unit_magnitude;

    if (cfg->unit_magnitude + cfg->sub_bucket_half_count_magnitude > 61)
    {
        return EINVAL;
    }

    cfg->bucket_count = buckets_needed_to_cover_value(highest_trackable_value, cfg->sub_bucket_count, (int32_t)cfg->unit_magnitude);
    cfg->counts_len = (cfg->bucket_count + 1) * (cfg->sub_bucket_count / 2);

    return 0;
}